

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

void __thiscall QResourceFileEnginePrivate::uncompress(QResourceFileEnginePrivate *this)

{
  long lVar1;
  bool bVar2;
  Compression CVar3;
  qint64 qVar4;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QResource *in_stack_00000030;
  QByteArray *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CVar3 = QResource::compressionAlgorithm((QResource *)in_RDI);
  if (((CVar3 != NoCompression) && (bVar2 = QByteArray::isEmpty((QByteArray *)0x2e9d01), bVar2)) &&
     (qVar4 = QResource::size((QResource *)in_RDI), qVar4 != 0)) {
    QResource::uncompressedData(in_stack_00000030);
    QByteArray::operator=(in_RDI,in_stack_ffffffffffffffc8);
    QByteArray::~QByteArray((QByteArray *)0x2e9d4d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QResourceFileEnginePrivate::uncompress() const
{
    if (resource.compressionAlgorithm() == QResource::NoCompression
            || !uncompressed.isEmpty() || resource.size() == 0)
        return;     // nothing to do
    uncompressed = resource.uncompressedData();
}